

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_pack8.h
# Opt level: O1

void ncnn::convdw3x3s1_pack8_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined8 *puVar1;
  undefined1 (*pauVar2) [12];
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  undefined1 (*pauVar13) [28];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  int iVar17;
  uint uVar18;
  int iVar19;
  void *pvVar20;
  void *pvVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined8 uVar133;
  undefined8 uVar134;
  undefined8 uVar135;
  undefined8 uVar136;
  undefined8 uVar137;
  undefined8 uVar138;
  undefined8 uVar139;
  undefined8 uVar140;
  undefined1 auVar141 [12];
  undefined1 auVar142 [12];
  undefined1 auVar143 [12];
  undefined1 auVar144 [28];
  undefined1 auVar145 [28];
  int iVar146;
  uint uVar147;
  uint uVar148;
  long lVar149;
  long lVar150;
  int iVar151;
  long lVar152;
  float *pfVar153;
  float *pfVar154;
  float *pfVar155;
  float *pfVar156;
  undefined8 uVar157;
  undefined8 uVar158;
  undefined8 uVar159;
  undefined8 uVar160;
  float fVar161;
  float fVar162;
  float in_register_0000129c;
  float in_register_000012dc;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar176 [64];
  float in_register_0000149c;
  float fVar177;
  float fVar178;
  float fVar179;
  float in_register_000014dc;
  float in_register_0000159c;
  float fVar180;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  
  iVar17 = bottom_blob->c;
  if (0 < (long)iVar17) {
    uVar18 = top_blob->w;
    iVar19 = top_blob->h;
    pvVar20 = _bias->data;
    lVar150 = 0;
    do {
      if (pvVar20 == (void *)0x0) {
        uVar158 = 0;
        uVar157 = 0;
        uVar159 = 0;
        uVar160 = 0;
      }
      else {
        puVar1 = (undefined8 *)((long)pvVar20 + lVar150 * 0x20);
        uVar157 = *puVar1;
        uVar158 = puVar1[1];
        uVar159 = puVar1[2];
        uVar160 = puVar1[3];
      }
      local_1f8 = (float)uVar157;
      fStack_1f4 = (float)((ulong)uVar157 >> 0x20);
      fStack_1f0 = (float)uVar158;
      fStack_1ec = (float)((ulong)uVar158 >> 0x20);
      fStack_1e8 = (float)uVar159;
      fStack_1e4 = (float)((ulong)uVar159 >> 0x20);
      fStack_1e0 = (float)uVar160;
      fStack_1dc = (float)((ulong)uVar160 >> 0x20);
      if (0 < iVar19) {
        pfVar155 = (float *)(top_blob->cstep * lVar150 * top_blob->elemsize + (long)top_blob->data);
        lVar149 = kernel->w * lVar150 * kernel->elemsize;
        pvVar21 = kernel->data;
        pauVar2 = (undefined1 (*) [12])((long)pvVar21 + lVar149);
        auVar143 = *pauVar2;
        auVar142 = *pauVar2;
        local_198 = (float)*(undefined8 *)*pauVar2;
        fStack_194 = (float)((ulong)*(undefined8 *)*pauVar2 >> 0x20);
        fStack_190 = (float)*(undefined8 *)(*pauVar2 + 8);
        fStack_18c = (float)((ulong)*(undefined8 *)(*pauVar2 + 8) >> 0x20);
        fStack_188 = (float)*(undefined8 *)(pauVar2[1] + 4);
        fStack_184 = (float)((ulong)*(undefined8 *)(pauVar2[1] + 4) >> 0x20);
        fStack_180 = (float)*(undefined8 *)pauVar2[2];
        fStack_17c = (float)((ulong)*(undefined8 *)pauVar2[2] >> 0x20);
        pauVar2 = (undefined1 (*) [12])((long)pvVar21 + lVar149 + 0x20);
        auVar141 = *pauVar2;
        local_178 = (float)*(undefined8 *)*pauVar2;
        fStack_174 = (float)((ulong)*(undefined8 *)*pauVar2 >> 0x20);
        fStack_170 = (float)*(undefined8 *)(*pauVar2 + 8);
        fStack_16c = (float)((ulong)*(undefined8 *)(*pauVar2 + 8) >> 0x20);
        fStack_168 = (float)*(undefined8 *)(pauVar2[1] + 4);
        fStack_164 = (float)((ulong)*(undefined8 *)(pauVar2[1] + 4) >> 0x20);
        fStack_160 = (float)*(undefined8 *)pauVar2[2];
        fStack_15c = (float)((ulong)*(undefined8 *)pauVar2[2] >> 0x20);
        puVar1 = (undefined8 *)((long)pvVar21 + lVar149 + 0x40);
        uVar157 = *puVar1;
        uVar158 = puVar1[1];
        uVar159 = puVar1[2];
        uVar160 = puVar1[3];
        pfVar154 = (float *)((long)pvVar21 + lVar149 + 0x60);
        fVar101 = *pfVar154;
        fVar102 = pfVar154[1];
        fVar103 = pfVar154[2];
        fVar104 = pfVar154[3];
        fVar105 = pfVar154[4];
        fVar106 = pfVar154[5];
        fVar107 = pfVar154[6];
        fVar108 = pfVar154[7];
        auVar14 = *(undefined1 (*) [32])((long)pvVar21 + lVar149 + 0x80);
        pfVar154 = (float *)((long)pvVar21 + lVar149 + 0xa0);
        fVar125 = *pfVar154;
        fVar126 = pfVar154[1];
        fVar127 = pfVar154[2];
        fVar128 = pfVar154[3];
        fVar129 = pfVar154[4];
        fVar130 = pfVar154[5];
        fVar131 = pfVar154[6];
        fVar132 = pfVar154[7];
        pauVar13 = (undefined1 (*) [28])((long)pvVar21 + lVar149 + 0xc0);
        fVar109 = *(float *)*pauVar13;
        fVar110 = *(float *)(*pauVar13 + 4);
        fVar111 = *(float *)(*pauVar13 + 8);
        fVar112 = *(float *)(*pauVar13 + 0xc);
        fVar113 = *(float *)(*pauVar13 + 0x10);
        fVar114 = *(float *)(*pauVar13 + 0x14);
        fVar115 = *(float *)(*pauVar13 + 0x18);
        auVar144 = *pauVar13;
        fVar116 = *(float *)pauVar13[1];
        pauVar13 = (undefined1 (*) [28])((long)pvVar21 + lVar149 + 0xe0);
        fVar117 = *(float *)*pauVar13;
        fVar118 = *(float *)(*pauVar13 + 4);
        fVar119 = *(float *)(*pauVar13 + 8);
        fVar120 = *(float *)(*pauVar13 + 0xc);
        fVar121 = *(float *)(*pauVar13 + 0x10);
        fVar122 = *(float *)(*pauVar13 + 0x14);
        fVar123 = *(float *)(*pauVar13 + 0x18);
        auVar145 = *pauVar13;
        fVar124 = *(float *)pauVar13[1];
        auVar15 = *(undefined1 (*) [32])((long)pvVar21 + lVar149 + 0x100);
        auVar176 = ZEXT3264(auVar15);
        pfVar156 = (float *)(bottom_blob->cstep * lVar150 * bottom_blob->elemsize +
                            (long)bottom_blob->data);
        lVar149 = (long)bottom_blob->w * bottom_blob->elemsize;
        pfVar154 = (float *)((long)pfVar156 + lVar149 * 2);
        pfVar153 = (float *)(lVar149 + (long)pfVar156);
        iVar151 = 0;
        fVar162 = fVar108;
        do {
          fStack_154 = (float)((ulong)uVar157 >> 0x20);
          fStack_14c = (float)((ulong)uVar158 >> 0x20);
          fStack_144 = (float)((ulong)uVar159 >> 0x20);
          local_1b8 = auVar14._0_4_;
          fStack_1b4 = auVar14._4_4_;
          fStack_1b0 = auVar14._8_4_;
          fStack_1ac = auVar14._12_4_;
          fStack_1a8 = auVar14._16_4_;
          fStack_1a4 = auVar14._20_4_;
          fStack_1a0 = auVar14._24_4_;
          local_b8 = auVar15._0_4_;
          fStack_b4 = auVar15._4_4_;
          fStack_b0 = auVar15._8_4_;
          fStack_ac = auVar15._12_4_;
          fStack_a8 = auVar15._16_4_;
          fStack_a4 = auVar15._20_4_;
          fStack_a0 = auVar15._24_4_;
          fStack_9c = auVar15._28_4_;
          local_158 = (float)uVar157;
          fStack_150 = (float)uVar158;
          fStack_148 = (float)uVar159;
          fStack_140 = (float)uVar160;
          if ((int)uVar18 < 8) {
            uVar148 = 0;
          }
          else {
            iVar146 = 7;
            do {
              fVar162 = pfVar156[1];
              fVar22 = pfVar156[2];
              fVar164 = pfVar156[3];
              fVar165 = pfVar156[4];
              fVar166 = pfVar156[5];
              fVar177 = pfVar156[6];
              fVar28 = pfVar156[8];
              fVar31 = pfVar156[9];
              fVar23 = pfVar156[10];
              fVar24 = pfVar156[0xb];
              fVar25 = pfVar156[0xc];
              fVar26 = pfVar156[0xd];
              fVar27 = pfVar156[0xe];
              fVar29 = pfVar156[0xf];
              fVar30 = pfVar156[0x10];
              fVar32 = pfVar156[0x11];
              fVar33 = pfVar156[0x12];
              fVar34 = pfVar156[0x13];
              fVar35 = pfVar156[0x14];
              fVar36 = pfVar156[0x15];
              fVar37 = pfVar156[0x16];
              fVar38 = pfVar156[0x17];
              fVar39 = pfVar156[0x18];
              fVar40 = pfVar156[0x19];
              fVar41 = pfVar156[0x1a];
              fVar42 = pfVar156[0x1b];
              fVar43 = pfVar156[0x1c];
              fVar44 = pfVar156[0x1d];
              fVar45 = pfVar156[0x1e];
              fVar46 = pfVar156[0x1f];
              fVar47 = pfVar153[1];
              fVar48 = pfVar153[2];
              fVar49 = pfVar153[3];
              fVar50 = pfVar153[4];
              fVar51 = pfVar153[5];
              fVar52 = pfVar153[6];
              fVar53 = pfVar153[8];
              fVar54 = pfVar153[9];
              fVar55 = pfVar153[10];
              fVar56 = pfVar153[0xb];
              fVar57 = pfVar153[0xc];
              fVar58 = pfVar153[0xd];
              fVar59 = pfVar153[0xe];
              fVar60 = pfVar153[0xf];
              fVar61 = pfVar153[0x10];
              fVar171 = pfVar153[0x11];
              fVar62 = pfVar153[0x12];
              fVar63 = pfVar153[0x13];
              fVar64 = pfVar153[0x14];
              fVar65 = pfVar153[0x15];
              fVar66 = pfVar153[0x16];
              fVar67 = pfVar153[0x18];
              fVar68 = pfVar153[0x19];
              fVar69 = pfVar153[0x1a];
              fVar70 = pfVar153[0x1b];
              fVar71 = pfVar153[0x1c];
              fVar72 = pfVar153[0x1d];
              fVar73 = pfVar153[0x1e];
              fVar74 = pfVar153[0x1f];
              fVar75 = pfVar154[1];
              fVar76 = pfVar154[2];
              fVar77 = pfVar154[3];
              fVar78 = pfVar154[4];
              fVar79 = pfVar154[5];
              fVar80 = pfVar154[6];
              fVar81 = pfVar154[8];
              fVar170 = pfVar154[9];
              fVar82 = pfVar154[10];
              fVar83 = pfVar154[0xb];
              fVar84 = pfVar154[0xc];
              fVar85 = pfVar154[0xd];
              fVar86 = pfVar154[0xe];
              fVar87 = pfVar154[0x10];
              fVar88 = pfVar154[0x11];
              fVar89 = pfVar154[0x12];
              fVar90 = pfVar154[0x13];
              fVar91 = pfVar154[0x14];
              fVar92 = pfVar154[0x15];
              fVar161 = pfVar154[0x16];
              fVar168 = pfVar154[0x17];
              fVar173 = pfVar154[0x18];
              fVar174 = pfVar154[0x19];
              fVar93 = pfVar154[0x1a];
              fVar175 = pfVar154[0x1b];
              fVar178 = pfVar154[0x1c];
              fVar179 = pfVar154[0x1d];
              fVar180 = pfVar154[0x1e];
              fVar94 = pfVar154[0x1f];
              fVar167 = fVar132 + in_register_0000159c + fVar124;
              fVar169 = fVar108 + fVar124 + fVar108;
              fVar172 = fVar60 + fVar60 + fVar108;
              fVar163 = fVar60 + pfVar154[0xf] + fVar167;
              *pfVar155 = local_198 * *pfVar156 + local_1f8 +
                          fVar30 * local_158 + fVar28 * local_178 +
                          fVar101 * *pfVar153 + fVar53 * local_1b8 + fVar61 * fVar125 +
                          fVar109 * *pfVar154 + fVar81 * fVar117 + fVar87 * local_b8;
              pfVar155[1] = fStack_194 * fVar162 + fStack_1f4 +
                            fVar32 * fStack_154 + fVar31 * fStack_174 +
                            fVar102 * fVar47 + fVar54 * fStack_1b4 + fVar171 * fVar126 +
                            fVar110 * fVar75 + fVar170 * fVar118 + fVar88 * fStack_b4;
              pfVar155[2] = fStack_190 * fVar22 + fStack_1f0 +
                            fVar33 * fStack_150 + fVar23 * fStack_170 +
                            fVar103 * fVar48 + fVar55 * fStack_1b0 + fVar62 * fVar127 +
                            fVar111 * fVar76 + fVar82 * fVar119 + fVar89 * fStack_b0;
              pfVar155[3] = fStack_18c * fVar164 + fStack_1ec +
                            fVar34 * fStack_14c + fVar24 * fStack_16c +
                            fVar104 * fVar49 + fVar56 * fStack_1ac + fVar63 * fVar128 +
                            fVar112 * fVar77 + fVar83 * fVar120 + fVar90 * fStack_ac;
              pfVar155[4] = fStack_188 * fVar165 + fStack_1e8 +
                            fVar35 * fStack_148 + fVar25 * fStack_168 +
                            fVar105 * fVar50 + fVar57 * fStack_1a8 + fVar64 * fVar129 +
                            fVar113 * fVar78 + fVar84 * fVar121 + fVar91 * fStack_a8;
              pfVar155[5] = fStack_184 * fVar166 + fStack_1e4 +
                            fVar36 * fStack_144 + fVar26 * fStack_164 +
                            fVar106 * fVar51 + fVar58 * fStack_1a4 + fVar65 * fVar130 +
                            fVar114 * fVar79 + fVar85 * fVar122 + fVar92 * fStack_a4;
              pfVar155[6] = fStack_180 * fVar177 + fStack_1e0 +
                            fVar37 * fStack_140 + fVar27 * fStack_160 +
                            fVar107 * fVar52 + fVar59 * fStack_1a0 + fVar66 * fVar131 +
                            fVar115 * fVar80 + fVar86 * fVar123 + fVar161 * fStack_a0;
              pfVar155[7] = fStack_17c + fStack_1dc + in_register_000014dc + in_register_000012dc +
                            fVar167 + fVar169;
              fVar164 = fVar29 + fStack_1dc + fVar60 + fVar108 + fVar163 + fVar172 + fVar163;
              fVar162 = pfVar156[0x20];
              fVar29 = pfVar156[0x21];
              fVar47 = pfVar156[0x22];
              fVar48 = pfVar156[0x23];
              fVar49 = pfVar156[0x24];
              fVar50 = pfVar156[0x25];
              fVar51 = pfVar156[0x26];
              fVar22 = pfVar156[0x27];
              fVar52 = pfVar153[0x20];
              fVar60 = pfVar153[0x21];
              fVar75 = pfVar153[0x22];
              fVar76 = pfVar153[0x23];
              fVar77 = pfVar153[0x24];
              fVar78 = pfVar153[0x25];
              fVar79 = pfVar153[0x26];
              fVar80 = pfVar154[0x20];
              fVar163 = pfVar154[0x21];
              fVar95 = pfVar154[0x22];
              fVar96 = pfVar154[0x23];
              fVar97 = pfVar154[0x24];
              fVar98 = pfVar154[0x25];
              fVar99 = pfVar154[0x26];
              pfVar155[8] = fVar28 * local_198 + local_1f8 + fVar53 * fVar101 + fVar30 * local_178 +
                            fVar61 * local_1b8 + fVar81 * fVar109 + fVar87 * fVar117 +
                            fVar39 * local_158 + fVar67 * fVar125 + fVar173 * local_b8;
              pfVar155[9] = fVar31 * fStack_194 + fStack_1f4 +
                            fVar54 * fVar102 + fVar32 * fStack_174 +
                            fVar171 * fStack_1b4 + fVar170 * fVar110 + fVar88 * fVar118 +
                            fVar40 * fStack_154 + fVar68 * fVar126 + fVar174 * fStack_b4;
              pfVar155[10] = fVar23 * fStack_190 + fStack_1f0 +
                             fVar55 * fVar103 + fVar33 * fStack_170 +
                             fVar62 * fStack_1b0 + fVar82 * fVar111 + fVar89 * fVar119 +
                             fVar41 * fStack_150 + fVar69 * fVar127 + fVar93 * fStack_b0;
              pfVar155[0xb] =
                   fVar24 * fStack_18c + fStack_1ec + fVar56 * fVar104 + fVar34 * fStack_16c +
                   fVar63 * fStack_1ac + fVar83 * fVar112 + fVar90 * fVar120 +
                   fVar42 * fStack_14c + fVar70 * fVar128 + fVar175 * fStack_ac;
              pfVar155[0xc] =
                   fVar25 * fStack_188 + fStack_1e8 + fVar57 * fVar105 + fVar35 * fStack_168 +
                   fVar64 * fStack_1a8 + fVar84 * fVar113 + fVar91 * fVar121 +
                   fVar43 * fStack_148 + fVar71 * fVar129 + fVar178 * fStack_a8;
              pfVar155[0xd] =
                   fVar26 * fStack_184 + fStack_1e4 + fVar58 * fVar106 + fVar36 * fStack_164 +
                   fVar65 * fStack_1a4 + fVar85 * fVar114 + fVar92 * fVar122 +
                   fVar44 * fStack_144 + fVar72 * fVar130 + fVar179 * fStack_a4;
              pfVar155[0xe] =
                   fVar27 * fStack_180 + fStack_1e0 + fVar59 * fVar107 + fVar37 * fStack_160 +
                   fVar66 * fStack_1a0 + fVar86 * fVar115 + fVar161 * fVar123 +
                   fVar45 * fStack_140 + fVar73 * fVar131 + fVar180 * fStack_a0;
              pfVar155[0xf] = fVar164;
              fVar165 = fVar164 + fVar169 + fVar167 + fVar172;
              fVar23 = pfVar156[0x28];
              fVar24 = pfVar156[0x29];
              fVar25 = pfVar156[0x2a];
              fVar26 = pfVar156[0x2b];
              fVar27 = pfVar156[0x2c];
              fVar53 = pfVar156[0x2d];
              fVar54 = pfVar156[0x2e];
              fVar164 = pfVar156[0x2f];
              fVar55 = pfVar153[0x28];
              fVar56 = pfVar153[0x29];
              fVar57 = pfVar153[0x2a];
              fVar58 = pfVar153[0x2b];
              fVar59 = pfVar153[0x2c];
              fVar81 = pfVar153[0x2d];
              fVar170 = pfVar153[0x2e];
              fVar166 = fVar169 + fVar165;
              fVar177 = fVar46 + fStack_1dc + fVar74 + fVar94;
              fVar46 = pfVar154[0x28];
              fVar82 = pfVar154[0x29];
              fVar83 = pfVar154[0x2a];
              fVar84 = pfVar154[0x2b];
              fVar85 = pfVar154[0x2c];
              fVar86 = pfVar154[0x2d];
              fVar100 = pfVar154[0x2e];
              fVar169 = fVar177 + fVar172 + fVar169 + fVar166;
              fVar177 = fVar177 + fVar168 + fVar172;
              pfVar155[0x10] =
                   fVar80 * local_b8 + fVar162 * local_158 + fVar52 * fVar125 +
                   fVar30 * local_198 + local_1f8 + fVar61 * fVar101 + fVar87 * fVar109 +
                   fVar39 * local_178 + fVar67 * local_1b8 + fVar173 * fVar117;
              pfVar155[0x11] =
                   fVar163 * fStack_b4 + fVar29 * fStack_154 + fVar60 * fVar126 +
                   fVar32 * fStack_194 + fStack_1f4 + fVar171 * fVar102 + fVar88 * fVar110 +
                   fVar40 * fStack_174 + fVar68 * fStack_1b4 + fVar174 * fVar118;
              pfVar155[0x12] =
                   fVar95 * fStack_b0 + fVar47 * fStack_150 + fVar75 * fVar127 +
                   fVar33 * fStack_190 + fStack_1f0 + fVar62 * fVar103 + fVar89 * fVar111 +
                   fVar41 * fStack_170 + fVar69 * fStack_1b0 + fVar93 * fVar119;
              pfVar155[0x13] =
                   fVar96 * fStack_ac + fVar48 * fStack_14c + fVar76 * fVar128 +
                   fVar34 * fStack_18c + fStack_1ec + fVar63 * fVar104 + fVar90 * fVar112 +
                   fVar42 * fStack_16c + fVar70 * fStack_1ac + fVar175 * fVar120;
              pfVar155[0x14] =
                   fVar97 * fStack_a8 + fVar49 * fStack_148 + fVar77 * fVar129 +
                   fVar35 * fStack_188 + fStack_1e8 + fVar64 * fVar105 + fVar91 * fVar113 +
                   fVar43 * fStack_168 + fVar71 * fStack_1a8 + fVar178 * fVar121;
              pfVar155[0x15] =
                   fVar98 * fStack_a4 + fVar50 * fStack_144 + fVar78 * fVar130 +
                   fVar36 * fStack_184 + fStack_1e4 + fVar65 * fVar106 + fVar92 * fVar114 +
                   fVar44 * fStack_164 + fVar72 * fStack_1a4 + fVar179 * fVar122;
              pfVar155[0x16] =
                   fVar99 * fStack_a0 + fVar51 * fStack_140 + fVar79 * fVar131 +
                   fVar37 * fStack_180 + fStack_1e0 + fVar66 * fVar107 + fVar161 * fVar115 +
                   fVar45 * fStack_160 + fVar73 * fStack_1a0 + fVar180 * fVar123;
              pfVar155[0x17] =
                   fVar74 + fVar94 + fVar166 + fVar38 + fStack_1dc + fVar167 + fVar172 + fVar165;
              fVar30 = pfVar156[0x30];
              fVar32 = pfVar156[0x31];
              fVar33 = pfVar156[0x32];
              fVar34 = pfVar156[0x33];
              fVar35 = pfVar156[0x34];
              fVar36 = pfVar156[0x35];
              fVar37 = pfVar156[0x36];
              in_register_000014dc = pfVar156[0x37];
              fVar38 = pfVar153[0x30];
              fVar61 = pfVar153[0x31];
              fVar171 = pfVar153[0x32];
              fVar62 = pfVar153[0x33];
              fVar63 = pfVar153[0x34];
              fVar64 = pfVar153[0x35];
              fVar65 = pfVar153[0x36];
              fVar66 = pfVar154[0x30];
              fVar74 = pfVar154[0x31];
              fVar87 = pfVar154[0x32];
              fVar88 = pfVar154[0x33];
              fVar89 = pfVar154[0x34];
              fVar90 = pfVar154[0x35];
              fVar91 = pfVar154[0x36];
              pfVar155[0x18] =
                   fVar39 * local_198 + local_1f8 + fVar67 * fVar101 + fVar173 * fVar109 +
                   fVar162 * local_178 + fVar52 * local_1b8 + fVar80 * fVar117 +
                   local_b8 * fVar46 + fVar23 * local_158 + fVar55 * fVar125;
              pfVar155[0x19] =
                   fVar40 * fStack_194 + fStack_1f4 + fVar68 * fVar102 + fVar174 * fVar110 +
                   fVar29 * fStack_174 + fVar60 * fStack_1b4 + fVar163 * fVar118 +
                   fStack_b4 * fVar82 + fVar24 * fStack_154 + fVar56 * fVar126;
              pfVar155[0x1a] =
                   fVar41 * fStack_190 + fStack_1f0 + fVar69 * fVar103 + fVar93 * fVar111 +
                   fVar47 * fStack_170 + fVar75 * fStack_1b0 + fVar95 * fVar119 +
                   fStack_b0 * fVar83 + fVar25 * fStack_150 + fVar57 * fVar127;
              pfVar155[0x1b] =
                   fVar42 * fStack_18c + fStack_1ec + fVar70 * fVar104 + fVar175 * fVar112 +
                   fVar48 * fStack_16c + fVar76 * fStack_1ac + fVar96 * fVar120 +
                   fStack_ac * fVar84 + fVar26 * fStack_14c + fVar58 * fVar128;
              pfVar155[0x1c] =
                   fVar43 * fStack_188 + fStack_1e8 + fVar71 * fVar105 + fVar178 * fVar113 +
                   fVar49 * fStack_168 + fVar77 * fStack_1a8 + fVar97 * fVar121 +
                   fStack_a8 * fVar85 + fVar27 * fStack_148 + fVar59 * fVar129;
              pfVar155[0x1d] =
                   fVar44 * fStack_184 + fStack_1e4 + fVar72 * fVar106 + fVar179 * fVar114 +
                   fVar50 * fStack_164 + fVar78 * fStack_1a4 + fVar98 * fVar122 +
                   fStack_a4 * fVar86 + fVar53 * fStack_144 + fVar81 * fVar130;
              pfVar155[0x1e] =
                   fVar45 * fStack_180 + fStack_1e0 + fVar73 * fVar107 + fVar180 * fVar115 +
                   fVar51 * fStack_160 + fVar79 * fStack_1a0 + fVar99 * fVar123 +
                   fStack_a0 * fVar100 + fVar54 * fStack_140 + fVar170 * fVar131;
              pfVar155[0x1f] = fVar169 + fVar177;
              fVar161 = fVar22 + fStack_1dc + fVar164 + fVar177 +
                        fVar169 + fVar177 + fVar169 + fVar22 + fStack_1dc;
              fVar39 = pfVar156[0x38];
              fVar40 = pfVar156[0x39];
              fVar41 = pfVar156[0x3a];
              fVar42 = pfVar156[0x3b];
              fVar43 = pfVar156[0x3c];
              fVar44 = pfVar156[0x3d];
              fVar45 = pfVar156[0x3e];
              fVar67 = pfVar153[0x38];
              fVar68 = pfVar153[0x39];
              fVar69 = pfVar153[0x3a];
              fVar70 = pfVar153[0x3b];
              fVar71 = pfVar153[0x3c];
              fVar72 = pfVar153[0x3d];
              fVar73 = pfVar153[0x3e];
              fVar92 = pfVar153[0x3f];
              fVar173 = fVar177 + fStack_1dc;
              fVar168 = fVar169 + fVar177 + fVar169;
              fVar169 = fVar169 + fVar173;
              fVar174 = fVar177 + fVar161 + fVar173;
              auVar16 = *(undefined1 (*) [32])(pfVar154 + 0x38);
              fVar22 = auVar16._0_4_;
              fVar164 = auVar16._4_4_;
              fVar165 = auVar16._8_4_;
              fVar166 = auVar16._12_4_;
              fVar177 = auVar16._16_4_;
              fVar28 = auVar16._20_4_;
              fVar31 = auVar16._24_4_;
              pfVar155[0x20] =
                   fVar30 * local_158 + fVar38 * fVar125 + fVar66 * local_b8 +
                   fVar162 * local_198 + local_1f8 + fVar52 * fVar101 + fVar80 * fVar109 +
                   fVar23 * local_178 + fVar55 * local_1b8 + fVar46 * fVar117;
              pfVar155[0x21] =
                   fVar32 * fStack_154 + fVar61 * fVar126 + fVar74 * fStack_b4 +
                   fVar29 * fStack_194 + fStack_1f4 + fVar60 * fVar102 + fVar163 * fVar110 +
                   fVar24 * fStack_174 + fVar56 * fStack_1b4 + fVar82 * fVar118;
              pfVar155[0x22] =
                   fVar33 * fStack_150 + fVar171 * fVar127 + fVar87 * fStack_b0 +
                   fVar47 * fStack_190 + fStack_1f0 + fVar75 * fVar103 + fVar95 * fVar111 +
                   fVar25 * fStack_170 + fVar57 * fStack_1b0 + fVar83 * fVar119;
              pfVar155[0x23] =
                   fVar34 * fStack_14c + fVar62 * fVar128 + fVar88 * fStack_ac +
                   fVar48 * fStack_18c + fStack_1ec + fVar76 * fVar104 + fVar96 * fVar112 +
                   fVar26 * fStack_16c + fVar58 * fStack_1ac + fVar84 * fVar120;
              pfVar155[0x24] =
                   fVar35 * fStack_148 + fVar63 * fVar129 + fVar89 * fStack_a8 +
                   fVar49 * fStack_188 + fStack_1e8 + fVar77 * fVar105 + fVar97 * fVar113 +
                   fVar27 * fStack_168 + fVar59 * fStack_1a8 + fVar85 * fVar121;
              pfVar155[0x25] =
                   fVar36 * fStack_144 + fVar64 * fVar130 + fVar90 * fStack_a4 +
                   fVar50 * fStack_184 + fStack_1e4 + fVar78 * fVar106 + fVar98 * fVar114 +
                   fVar53 * fStack_164 + fVar81 * fStack_1a4 + fVar86 * fVar122;
              pfVar155[0x26] =
                   fVar37 * fStack_140 + fVar65 * fVar131 + fVar91 * fStack_a0 +
                   fVar51 * fStack_180 + fStack_1e0 + fVar79 * fVar107 + fVar99 * fVar115 +
                   fVar54 * fStack_160 + fVar170 * fStack_1a0 + fVar100 * fVar123;
              pfVar155[0x27] = fVar168 + fVar161;
              fVar161 = fVar173 + fVar161 + fStack_9c + fVar174 + fVar169 + fVar168;
              fVar29 = pfVar156[0x40];
              fVar47 = pfVar156[0x41];
              fVar48 = pfVar156[0x42];
              fVar49 = pfVar156[0x43];
              fVar50 = pfVar156[0x44];
              fVar51 = pfVar156[0x45];
              fVar52 = pfVar156[0x46];
              fVar162 = pfVar156[0x47];
              uVar133 = *(undefined8 *)(pfVar153 + 0x40);
              uVar134 = *(undefined8 *)(pfVar153 + 0x42);
              uVar135 = *(undefined8 *)(pfVar153 + 0x44);
              uVar136 = *(undefined8 *)(pfVar153 + 0x46);
              auVar16 = *(undefined1 (*) [32])(pfVar154 + 0x40);
              pfVar155[0x28] =
                   local_198 * fVar23 + local_1f8 + fVar55 * fVar101 + fVar46 * fVar109 +
                   fVar30 * local_178 + fVar38 * local_1b8 + fVar66 * fVar117 +
                   local_158 * fVar39 + fVar67 * fVar125 + local_b8 * fVar22;
              pfVar155[0x29] =
                   fStack_194 * fVar24 + fStack_1f4 + fVar56 * fVar102 + fVar82 * fVar110 +
                   fVar32 * fStack_174 + fVar61 * fStack_1b4 + fVar74 * fVar118 +
                   fStack_154 * fVar40 + fVar68 * fVar126 + fStack_b4 * fVar164;
              pfVar155[0x2a] =
                   fStack_190 * fVar25 + fStack_1f0 + fVar57 * fVar103 + fVar83 * fVar111 +
                   fVar33 * fStack_170 + fVar171 * fStack_1b0 + fVar87 * fVar119 +
                   fStack_150 * fVar41 + fVar69 * fVar127 + fStack_b0 * fVar165;
              pfVar155[0x2b] =
                   fStack_18c * fVar26 + fStack_1ec + fVar58 * fVar104 + fVar84 * fVar112 +
                   fVar34 * fStack_16c + fVar62 * fStack_1ac + fVar88 * fVar120 +
                   fStack_14c * fVar42 + fVar70 * fVar128 + fStack_ac * fVar166;
              pfVar155[0x2c] =
                   fStack_188 * fVar27 + fStack_1e8 + fVar59 * fVar105 + fVar85 * fVar113 +
                   fVar35 * fStack_168 + fVar63 * fStack_1a8 + fVar89 * fVar121 +
                   fStack_148 * fVar43 + fVar71 * fVar129 + fStack_a8 * fVar177;
              pfVar155[0x2d] =
                   fStack_184 * fVar53 + fStack_1e4 + fVar81 * fVar106 + fVar86 * fVar114 +
                   fVar36 * fStack_164 + fVar64 * fStack_1a4 + fVar90 * fVar122 +
                   fStack_144 * fVar44 + fVar72 * fVar130 + fStack_a4 * fVar28;
              pfVar155[0x2e] =
                   fStack_180 * fVar54 + fStack_1e0 + fVar170 * fVar107 + fVar100 * fVar115 +
                   fVar37 * fStack_160 + fVar65 * fStack_1a0 + fVar91 * fVar123 +
                   fStack_140 * fVar45 + fVar73 * fVar131 + fStack_a0 * fVar31;
              pfVar155[0x2f] = fVar161;
              fVar174 = in_register_000014dc + fVar174;
              local_118 = (float)uVar133;
              fStack_114 = (float)((ulong)uVar133 >> 0x20);
              fStack_110 = (float)uVar134;
              fStack_10c = (float)((ulong)uVar134 >> 0x20);
              fStack_108 = (float)uVar135;
              fStack_104 = (float)((ulong)uVar135 >> 0x20);
              fStack_100 = (float)uVar136;
              fVar23 = pfVar156[0x48];
              fVar24 = pfVar156[0x49];
              fVar25 = pfVar156[0x4a];
              fVar26 = pfVar156[0x4b];
              fVar27 = pfVar156[0x4c];
              fVar46 = pfVar156[0x4d];
              fVar53 = pfVar156[0x4e];
              fVar170 = in_register_000014dc + fVar174 + fVar174;
              fVar54 = pfVar153[0x48];
              fVar55 = pfVar153[0x49];
              fVar56 = pfVar153[0x4a];
              fVar57 = pfVar153[0x4b];
              fVar58 = pfVar153[0x4c];
              fVar59 = pfVar153[0x4d];
              fVar60 = pfVar153[0x4e];
              in_register_000012dc = fVar162 + fVar170;
              fVar75 = pfVar154[0x48];
              fVar76 = pfVar154[0x49];
              fVar77 = pfVar154[0x4a];
              fVar78 = pfVar154[0x4b];
              fVar79 = pfVar154[0x4c];
              fVar80 = pfVar154[0x4d];
              fVar81 = pfVar154[0x4e];
              in_register_0000129c = in_register_000012dc + fStack_1dc;
              pfVar155[0x30] =
                   fVar30 * local_198 + local_1f8 + fVar109 * fVar66 + fVar38 * fVar101 +
                   local_178 * fVar39 + fVar67 * local_1b8 + fVar22 * fVar117 +
                   local_158 * fVar29 + fVar125 * local_118 + local_b8 * auVar16._0_4_;
              pfVar155[0x31] =
                   fVar32 * fStack_194 + fStack_1f4 + fVar110 * fVar74 + fVar61 * fVar102 +
                   fStack_174 * fVar40 + fVar68 * fStack_1b4 + fVar164 * fVar118 +
                   fStack_154 * fVar47 + fVar126 * fStack_114 + fStack_b4 * auVar16._4_4_;
              pfVar155[0x32] =
                   fVar33 * fStack_190 + fStack_1f0 + fVar111 * fVar87 + fVar171 * fVar103 +
                   fStack_170 * fVar41 + fVar69 * fStack_1b0 + fVar165 * fVar119 +
                   fStack_150 * fVar48 + fVar127 * fStack_110 + fStack_b0 * auVar16._8_4_;
              pfVar155[0x33] =
                   fVar34 * fStack_18c + fStack_1ec + fVar112 * fVar88 + fVar62 * fVar104 +
                   fStack_16c * fVar42 + fVar70 * fStack_1ac + fVar166 * fVar120 +
                   fStack_14c * fVar49 + fVar128 * fStack_10c + fStack_ac * auVar16._12_4_;
              pfVar155[0x34] =
                   fVar35 * fStack_188 + fStack_1e8 + fVar113 * fVar89 + fVar63 * fVar105 +
                   fStack_168 * fVar43 + fVar71 * fStack_1a8 + fVar177 * fVar121 +
                   fStack_148 * fVar50 + fVar129 * fStack_108 + fStack_a8 * auVar16._16_4_;
              pfVar155[0x35] =
                   fVar36 * fStack_184 + fStack_1e4 + fVar114 * fVar90 + fVar64 * fVar106 +
                   fStack_164 * fVar44 + fVar72 * fStack_1a4 + fVar28 * fVar122 +
                   fStack_144 * fVar51 + fVar130 * fStack_104 + fStack_a4 * auVar16._20_4_;
              pfVar155[0x36] =
                   fVar37 * fStack_180 + fStack_1e0 + fVar115 * fVar91 + fVar65 * fVar107 +
                   fStack_160 * fVar45 + fVar73 * fStack_1a0 + fVar31 * fVar123 +
                   fStack_140 * fVar52 + fVar131 * fStack_100 + fStack_a0 * auVar16._24_4_;
              pfVar155[0x37] =
                   fVar169 + fStack_1dc + fVar174 + fVar161 + fVar169 + fVar174 + fVar170;
              fVar162 = fStack_17c + fStack_1dc + fVar92 + auVar16._28_4_ + in_register_0000129c +
                        in_register_000014dc + fVar174 + fStack_17c + fStack_1dc;
              pfVar155[0x38] =
                   local_198 * fVar39 + local_1f8 + fVar67 * fVar101 + fVar109 * fVar22 +
                   local_178 * fVar29 + local_1b8 * local_118 + auVar16._0_4_ * fVar117 +
                   local_158 * fVar23 + fVar125 * fVar54 + local_b8 * fVar75;
              pfVar155[0x39] =
                   fStack_194 * fVar40 + fStack_1f4 + fVar68 * fVar102 + fVar110 * fVar164 +
                   fStack_174 * fVar47 + fStack_1b4 * fStack_114 + auVar16._4_4_ * fVar118 +
                   fStack_154 * fVar24 + fVar126 * fVar55 + fStack_b4 * fVar76;
              pfVar155[0x3a] =
                   fStack_190 * fVar41 + fStack_1f0 + fVar69 * fVar103 + fVar111 * fVar165 +
                   fStack_170 * fVar48 + fStack_1b0 * fStack_110 + auVar16._8_4_ * fVar119 +
                   fStack_150 * fVar25 + fVar127 * fVar56 + fStack_b0 * fVar77;
              pfVar155[0x3b] =
                   fStack_18c * fVar42 + fStack_1ec + fVar70 * fVar104 + fVar112 * fVar166 +
                   fStack_16c * fVar49 + fStack_1ac * fStack_10c + auVar16._12_4_ * fVar120 +
                   fStack_14c * fVar26 + fVar128 * fVar57 + fStack_ac * fVar78;
              pfVar155[0x3c] =
                   fStack_188 * fVar43 + fStack_1e8 + fVar71 * fVar105 + fVar113 * fVar177 +
                   fStack_168 * fVar50 + fStack_1a8 * fStack_108 + auVar16._16_4_ * fVar121 +
                   fStack_148 * fVar27 + fVar129 * fVar58 + fStack_a8 * fVar79;
              pfVar155[0x3d] =
                   fStack_184 * fVar44 + fStack_1e4 + fVar72 * fVar106 + fVar114 * fVar28 +
                   fStack_164 * fVar51 + fStack_1a4 * fStack_104 + auVar16._20_4_ * fVar122 +
                   fStack_144 * fVar46 + fVar130 * fVar59 + fStack_a4 * fVar80;
              pfVar155[0x3e] =
                   fStack_180 * fVar45 + fStack_1e0 + fVar73 * fVar107 + fVar115 * fVar31 +
                   fStack_160 * fVar52 + fStack_1a0 * fStack_100 + auVar16._24_4_ * fVar123 +
                   fStack_140 * fVar53 + fVar131 * fVar60 + fStack_a0 * fVar81;
              pfVar155[0x3f] = fVar162;
              pfVar156 = pfVar156 + 0x40;
              pfVar153 = pfVar153 + 0x40;
              pfVar154 = pfVar154 + 0x40;
              pfVar155 = pfVar155 + 0x40;
              iVar146 = iVar146 + 8;
              in_register_0000159c = fVar116;
            } while (iVar146 < (int)uVar18);
            auVar176 = ZEXT3264(auVar15);
            uVar148 = uVar18 & 0xfffffff8;
            in_register_0000149c = fStack_15c;
          }
          fStack_13c = (float)((ulong)uVar160 >> 0x20);
          fVar22 = auVar14._28_4_;
          if ((int)(uVar148 | 3) < (int)uVar18) {
            lVar149 = 0;
            uVar147 = uVar148;
            fVar164 = fVar116;
            do {
              pfVar3 = (float *)((long)pfVar156 + lVar149);
              fVar166 = pfVar3[1];
              fVar28 = pfVar3[2];
              fVar23 = pfVar3[3];
              fVar25 = pfVar3[4];
              fVar27 = pfVar3[5];
              fVar30 = pfVar3[6];
              pfVar4 = (float *)((long)pfVar156 + lVar149 + 0x20);
              fVar34 = *pfVar4;
              fVar35 = pfVar4[1];
              fVar36 = pfVar4[2];
              fVar37 = pfVar4[3];
              fVar38 = pfVar4[4];
              fVar39 = pfVar4[5];
              fVar40 = pfVar4[6];
              fVar41 = pfVar4[7];
              pfVar4 = (float *)((long)pfVar156 + lVar149 + 0x40);
              fVar42 = *pfVar4;
              fVar43 = pfVar4[1];
              fVar44 = pfVar4[2];
              fVar45 = pfVar4[3];
              fVar46 = pfVar4[4];
              fVar47 = pfVar4[5];
              fVar48 = pfVar4[6];
              fVar49 = pfVar4[7];
              puVar1 = (undefined8 *)((long)pfVar156 + lVar149 + 0x60);
              uVar133 = *puVar1;
              uVar134 = puVar1[1];
              uVar135 = puVar1[2];
              uVar136 = puVar1[3];
              fVar178 = auVar141._0_4_;
              fVar179 = auVar141._4_4_;
              fVar180 = auVar141._8_4_;
              pfVar4 = (float *)((long)pfVar153 + lVar149);
              fVar33 = pfVar4[1];
              fVar50 = pfVar4[2];
              fVar51 = pfVar4[3];
              fVar52 = pfVar4[4];
              fVar53 = pfVar4[5];
              fVar54 = pfVar4[6];
              pfVar5 = (float *)((long)pfVar153 + lVar149 + 0x20);
              fVar55 = *pfVar5;
              fVar56 = pfVar5[1];
              fVar57 = pfVar5[2];
              fVar58 = pfVar5[3];
              fVar59 = pfVar5[4];
              fVar60 = pfVar5[5];
              fVar61 = pfVar5[6];
              fVar171 = pfVar5[7];
              pfVar5 = (float *)((long)pfVar153 + lVar149 + 0x40);
              fVar62 = *pfVar5;
              fVar63 = pfVar5[1];
              fVar64 = pfVar5[2];
              fVar65 = pfVar5[3];
              fVar66 = pfVar5[4];
              fVar67 = pfVar5[5];
              fVar68 = pfVar5[6];
              fVar69 = pfVar5[7];
              puVar1 = (undefined8 *)((long)pfVar153 + lVar149 + 0x60);
              uVar137 = *puVar1;
              uVar138 = puVar1[1];
              uVar139 = puVar1[2];
              uVar140 = puVar1[3];
              pfVar11 = (float *)((long)pfVar154 + lVar149);
              fVar70 = pfVar11[1];
              fVar71 = pfVar11[2];
              fVar72 = pfVar11[3];
              fVar73 = pfVar11[4];
              fVar74 = pfVar11[5];
              fVar75 = pfVar11[6];
              pfVar5 = (float *)((long)pfVar154 + lVar149 + 0x20);
              fVar76 = *pfVar5;
              fVar77 = pfVar5[1];
              fVar78 = pfVar5[2];
              fVar79 = pfVar5[3];
              fVar80 = pfVar5[4];
              fVar81 = pfVar5[5];
              fVar170 = pfVar5[6];
              pfVar5 = (float *)((long)pfVar154 + lVar149 + 0x40);
              fVar82 = *pfVar5;
              fVar83 = pfVar5[1];
              fVar84 = pfVar5[2];
              fVar85 = pfVar5[3];
              fVar86 = pfVar5[4];
              fVar87 = pfVar5[5];
              fVar88 = pfVar5[6];
              auVar16 = *(undefined1 (*) [32])((long)pfVar154 + lVar149 + 0x60);
              fVar165 = auVar176._0_4_;
              fVar177 = auVar176._4_4_;
              fVar31 = auVar176._8_4_;
              fVar24 = auVar176._12_4_;
              fVar26 = auVar176._16_4_;
              fVar29 = auVar176._20_4_;
              fVar32 = auVar176._24_4_;
              fVar175 = in_register_0000159c + in_register_0000159c + fVar22;
              fVar162 = fVar162 + fStack_1dc + in_register_0000129c + fVar164 +
                        fVar108 + fVar22 + fVar22 + fVar175;
              pfVar5 = (float *)((long)pfVar155 + lVar149);
              *pfVar5 = local_198 * *pfVar3 + local_1f8 + fVar178 * fVar34 + local_158 * fVar42 +
                        fVar101 * *pfVar4 + fVar55 * local_1b8 + fVar125 * fVar62 +
                        fVar82 * fVar165 + fVar76 * fVar117 + fVar109 * *pfVar11;
              pfVar5[1] = fStack_194 * fVar166 + fStack_1f4 + fVar179 * fVar35 + fStack_154 * fVar43
                          + fVar102 * fVar33 + fVar56 * fStack_1b4 + fVar126 * fVar63 +
                          fVar83 * fVar177 + fVar77 * fVar118 + fVar110 * fVar70;
              pfVar5[2] = fStack_190 * fVar28 + fStack_1f0 + fVar180 * fVar36 + fStack_150 * fVar44
                          + fVar103 * fVar50 + fVar57 * fStack_1b0 + fVar127 * fVar64 +
                          fVar84 * fVar31 + fVar78 * fVar119 + fVar111 * fVar71;
              pfVar5[3] = fStack_18c * fVar23 + fStack_1ec +
                          fStack_16c * fVar37 + fStack_14c * fVar45 +
                          fVar104 * fVar51 + fVar58 * fStack_1ac + fVar128 * fVar65 +
                          fVar85 * fVar24 + fVar79 * fVar120 + fVar112 * fVar72;
              pfVar5[4] = fStack_188 * fVar25 + fStack_1e8 +
                          fStack_168 * fVar38 + fStack_148 * fVar46 +
                          fVar105 * fVar52 + fVar59 * fStack_1a8 + fVar129 * fVar66 +
                          fVar86 * fVar26 + fVar80 * fVar121 + fVar113 * fVar73;
              pfVar5[5] = fStack_184 * fVar27 + fStack_1e4 +
                          fStack_164 * fVar39 + fStack_144 * fVar47 +
                          fVar106 * fVar53 + fVar60 * fStack_1a4 + fVar130 * fVar67 +
                          fVar87 * fVar29 + fVar81 * fVar122 + fVar114 * fVar74;
              pfVar5[6] = fStack_180 * fVar30 + fStack_1e0 +
                          fStack_160 * fVar40 + fStack_140 * fVar48 +
                          fVar107 * fVar54 + fVar61 * fStack_1a0 + fVar131 * fVar68 +
                          fVar88 * fVar32 + fVar170 * fVar123 + fVar115 * fVar75;
              pfVar5[7] = fVar162;
              local_d8 = (float)uVar133;
              fStack_d4 = (float)((ulong)uVar133 >> 0x20);
              fStack_d0 = (float)uVar134;
              fStack_cc = (float)((ulong)uVar134 >> 0x20);
              fStack_c8 = (float)uVar135;
              fStack_c4 = (float)((ulong)uVar135 >> 0x20);
              fStack_c0 = (float)uVar136;
              fVar162 = fVar162 + fVar171;
              local_118 = (float)uVar137;
              fStack_114 = (float)((ulong)uVar137 >> 0x20);
              fStack_110 = (float)uVar138;
              fStack_10c = (float)((ulong)uVar138 >> 0x20);
              fStack_108 = (float)uVar139;
              fStack_104 = (float)((ulong)uVar139 >> 0x20);
              fStack_100 = (float)uVar140;
              fStack_fc = (float)((ulong)uVar140 >> 0x20);
              fVar171 = fVar175 + fVar171;
              fVar164 = fVar162 + fVar175 + fVar175;
              fVar166 = auVar16._0_4_;
              fVar28 = auVar16._4_4_;
              fVar23 = auVar16._8_4_;
              fVar25 = auVar16._12_4_;
              fVar27 = auVar16._16_4_;
              fVar30 = auVar16._20_4_;
              fVar33 = auVar16._24_4_;
              fVar162 = fVar41 + fStack_1dc + fVar162 + fVar164 + fVar171 + fVar164;
              pfVar3 = (float *)((long)pfVar156 + lVar149 + 0x80);
              fVar91 = *pfVar3;
              fVar92 = pfVar3[1];
              fVar161 = pfVar3[2];
              fVar168 = pfVar3[3];
              fVar173 = pfVar3[4];
              fVar174 = pfVar3[5];
              fVar93 = pfVar3[6];
              in_register_0000159c = pfVar3[7];
              pfVar3 = (float *)((long)pfVar153 + lVar149 + 0x80);
              fVar41 = *pfVar3;
              fVar50 = pfVar3[1];
              fVar51 = pfVar3[2];
              fVar52 = pfVar3[3];
              fVar53 = pfVar3[4];
              fVar54 = pfVar3[5];
              fVar70 = pfVar3[6];
              pfVar3 = (float *)((long)pfVar154 + lVar149 + 0x80);
              fVar71 = *pfVar3;
              fVar72 = pfVar3[1];
              fVar73 = pfVar3[2];
              fVar74 = pfVar3[3];
              fVar75 = pfVar3[4];
              fVar89 = pfVar3[5];
              fVar90 = pfVar3[6];
              in_register_000012dc = pfVar3[7];
              pfVar3 = (float *)((long)pfVar155 + lVar149 + 0x20);
              *pfVar3 = local_198 * fVar34 + local_1f8 + fVar178 * fVar42 + fVar55 * fVar101 +
                        fVar62 * local_1b8 + fVar76 * fVar109 + fVar82 * fVar117 +
                        local_158 * local_d8 + local_118 * fVar125 + fVar165 * fVar166;
              pfVar3[1] = fStack_194 * fVar35 + fStack_1f4 + fVar179 * fVar43 + fVar56 * fVar102 +
                          fVar63 * fStack_1b4 + fVar77 * fVar110 + fVar83 * fVar118 +
                          fStack_154 * fStack_d4 + fStack_114 * fVar126 + fVar177 * fVar28;
              pfVar3[2] = fStack_190 * fVar36 + fStack_1f0 + fVar180 * fVar44 + fVar57 * fVar103 +
                          fVar64 * fStack_1b0 + fVar78 * fVar111 + fVar84 * fVar119 +
                          fStack_150 * fStack_d0 + fStack_110 * fVar127 + fVar31 * fVar23;
              pfVar3[3] = fStack_18c * fVar37 + fStack_1ec + fStack_16c * fVar45 + fVar58 * fVar104
                          + fVar65 * fStack_1ac + fVar79 * fVar112 + fVar85 * fVar120 +
                          fStack_14c * fStack_cc + fStack_10c * fVar128 + fVar24 * fVar25;
              pfVar3[4] = fStack_188 * fVar38 + fStack_1e8 + fStack_168 * fVar46 + fVar59 * fVar105
                          + fVar66 * fStack_1a8 + fVar80 * fVar113 + fVar86 * fVar121 +
                          fStack_148 * fStack_c8 + fStack_108 * fVar129 + fVar26 * fVar27;
              pfVar3[5] = fStack_184 * fVar39 + fStack_1e4 + fStack_164 * fVar47 + fVar60 * fVar106
                          + fVar67 * fStack_1a4 + fVar81 * fVar114 + fVar87 * fVar122 +
                          fStack_144 * fStack_c4 + fStack_104 * fVar130 + fVar29 * fVar30;
              pfVar3[6] = fStack_180 * fVar40 + fStack_1e0 + fStack_160 * fVar48 + fVar61 * fVar107
                          + fVar68 * fStack_1a0 + fVar170 * fVar115 + fVar88 * fVar123 +
                          fStack_140 * fStack_c0 + fStack_100 * fVar131 + fVar32 * fVar33;
              pfVar3[7] = fVar162;
              fVar162 = fVar162 + fVar175 + fVar69 + fVar175;
              fVar164 = fVar171 + fVar175 + fVar162;
              fVar162 = fStack_1dc + fVar49 + fVar69 + fVar175 + fVar162 + fVar164;
              pfVar3 = (float *)((long)pfVar156 + lVar149 + 0xa0);
              fVar34 = *pfVar3;
              fVar35 = pfVar3[1];
              fVar36 = pfVar3[2];
              fVar37 = pfVar3[3];
              fVar38 = pfVar3[4];
              fVar39 = pfVar3[5];
              fVar40 = pfVar3[6];
              pfVar3 = (float *)((long)pfVar153 + lVar149 + 0xa0);
              fVar49 = *pfVar3;
              fVar55 = pfVar3[1];
              fVar56 = pfVar3[2];
              fVar57 = pfVar3[3];
              fVar58 = pfVar3[4];
              fVar59 = pfVar3[5];
              fVar60 = pfVar3[6];
              pfVar3 = (float *)((long)pfVar154 + lVar149 + 0xa0);
              fVar61 = *pfVar3;
              fVar171 = pfVar3[1];
              fVar69 = pfVar3[2];
              fVar76 = pfVar3[3];
              fVar77 = pfVar3[4];
              fVar78 = pfVar3[5];
              fVar79 = pfVar3[6];
              in_register_0000129c = fVar164 + fVar132 + fVar132;
              pfVar3 = (float *)((long)pfVar155 + lVar149 + 0x40);
              *pfVar3 = local_1f8 + auVar142._0_4_ * fVar42 + fVar62 * fVar101 + fVar82 * fVar109 +
                        fVar178 * local_d8 + local_118 * local_1b8 + fVar166 * fVar117 +
                        fVar91 * local_158 + fVar41 * fVar125 + fVar165 * fVar71;
              pfVar3[1] = fStack_1f4 + auVar142._4_4_ * fVar43 + fVar63 * fVar102 + fVar83 * fVar110
                          + fVar179 * fStack_d4 + fStack_114 * fStack_1b4 + fVar28 * fVar118 +
                          fVar92 * fStack_154 + fVar50 * fVar126 + fVar177 * fVar72;
              pfVar3[2] = fStack_1f0 + auVar142._8_4_ * fVar44 + fVar64 * fVar103 + fVar84 * fVar111
                          + fVar180 * fStack_d0 + fStack_110 * fStack_1b0 + fVar23 * fVar119 +
                          fVar161 * fStack_150 + fVar51 * fVar127 + fVar31 * fVar73;
              pfVar3[3] = fStack_1ec + fStack_18c * fVar45 + fVar65 * fVar104 + fVar85 * fVar112 +
                          fStack_16c * fStack_cc + fStack_10c * fStack_1ac + fVar25 * fVar120 +
                          fVar168 * fStack_14c + fVar52 * fVar128 + fVar24 * fVar74;
              pfVar3[4] = fStack_1e8 + fStack_188 * fVar46 + fVar66 * fVar105 + fVar86 * fVar113 +
                          fStack_168 * fStack_c8 + fStack_108 * fStack_1a8 + fVar27 * fVar121 +
                          fVar173 * fStack_148 + fVar53 * fVar129 + fVar26 * fVar75;
              pfVar3[5] = fStack_1e4 + fStack_184 * fVar47 + fVar67 * fVar106 + fVar87 * fVar114 +
                          fStack_164 * fStack_c4 + fStack_104 * fStack_1a4 + fVar30 * fVar122 +
                          fVar174 * fStack_144 + fVar54 * fVar130 + fVar29 * fVar89;
              pfVar3[6] = fStack_1e0 + fStack_180 * fVar48 + fVar68 * fVar107 + fVar88 * fVar115 +
                          fStack_160 * fStack_c0 + fStack_100 * fStack_1a0 + fVar33 * fVar123 +
                          fVar93 * fStack_140 + fVar70 * fVar131 + fVar32 * fVar90;
              pfVar3[7] = fVar162;
              fVar164 = fStack_1dc + fVar132;
              auVar176 = ZEXT3264(auVar176._0_32_);
              fVar162 = fVar164 + fVar132 + fStack_fc + fVar162 + fVar132 + in_register_000012dc +
                        in_register_0000129c;
              pfVar3 = (float *)((long)pfVar155 + lVar149 + 0x60);
              *pfVar3 = local_1f8 + auVar142._0_4_ * local_d8 +
                        local_118 * fVar101 + fVar109 * fVar166 +
                        fVar91 * fVar178 + fVar41 * local_1b8 + fVar71 * fVar117 +
                        local_158 * fVar34 + fVar125 * fVar49 + fVar165 * fVar61;
              pfVar3[1] = fStack_1f4 + auVar142._4_4_ * fStack_d4 +
                          fStack_114 * fVar102 + fVar110 * fVar28 +
                          fVar92 * fVar179 + fVar50 * fStack_1b4 + fVar72 * fVar118 +
                          fStack_154 * fVar35 + fVar126 * fVar55 + fVar177 * fVar171;
              pfVar3[2] = fStack_1f0 + auVar142._8_4_ * fStack_d0 +
                          fStack_110 * fVar103 + fVar111 * fVar23 +
                          fVar161 * fVar180 + fVar51 * fStack_1b0 + fVar73 * fVar119 +
                          fStack_150 * fVar36 + fVar127 * fVar56 + fVar31 * fVar69;
              pfVar3[3] = fStack_1ec + fStack_18c * fStack_cc +
                          fStack_10c * fVar104 + fVar112 * fVar25 +
                          fVar168 * fStack_16c + fVar52 * fStack_1ac + fVar74 * fVar120 +
                          fStack_14c * fVar37 + fVar128 * fVar57 + fVar24 * fVar76;
              pfVar3[4] = fStack_1e8 + fStack_188 * fStack_c8 +
                          fStack_108 * fVar105 + fVar113 * fVar27 +
                          fVar173 * fStack_168 + fVar53 * fStack_1a8 + fVar75 * fVar121 +
                          fStack_148 * fVar38 + fVar129 * fVar58 + fVar26 * fVar77;
              pfVar3[5] = fStack_1e4 + fStack_184 * fStack_c4 +
                          fStack_104 * fVar106 + fVar114 * fVar30 +
                          fVar174 * fStack_164 + fVar54 * fStack_1a4 + fVar89 * fVar122 +
                          fStack_144 * fVar39 + fVar130 * fVar59 + fVar29 * fVar78;
              pfVar3[6] = fStack_1e0 + fStack_180 * fStack_c0 +
                          fStack_100 * fVar107 + fVar115 * fVar33 +
                          fVar93 * fStack_160 + fVar70 * fStack_1a0 + fVar90 * fVar123 +
                          fStack_140 * fVar40 + fVar131 * fVar60 + fVar32 * fVar79;
              pfVar3[7] = fVar162;
              uVar148 = uVar147 + 4;
              lVar149 = lVar149 + 0x80;
              iVar146 = uVar147 + 7;
              uVar147 = uVar148;
            } while (iVar146 < (int)uVar18);
            pfVar155 = (float *)((long)pfVar155 + lVar149);
            pfVar156 = (float *)((long)pfVar156 + lVar149);
            pfVar153 = (float *)((long)pfVar153 + lVar149);
            pfVar154 = (float *)((long)pfVar154 + lVar149);
            in_register_0000149c = fStack_13c;
            in_register_000014dc = fVar116;
          }
          if ((int)(uVar148 | 1) < (int)uVar18) {
            lVar149 = 0;
            uVar147 = uVar148;
            do {
              pfVar3 = (float *)((long)pfVar156 + lVar149 + 0x20);
              fVar164 = *pfVar3;
              fVar165 = pfVar3[1];
              fVar166 = pfVar3[2];
              fVar177 = pfVar3[3];
              fVar28 = pfVar3[4];
              fVar31 = pfVar3[5];
              fVar23 = pfVar3[6];
              pfVar3 = (float *)((long)pfVar156 + lVar149 + 0x40);
              fVar24 = *pfVar3;
              fVar25 = pfVar3[1];
              fVar26 = pfVar3[2];
              fVar27 = pfVar3[3];
              fVar29 = pfVar3[4];
              fVar30 = pfVar3[5];
              fVar32 = pfVar3[6];
              pfVar3 = (float *)((long)pfVar153 + lVar149 + 0x20);
              fVar33 = *pfVar3;
              fVar34 = pfVar3[1];
              fVar35 = pfVar3[2];
              fVar36 = pfVar3[3];
              fVar37 = pfVar3[4];
              fVar38 = pfVar3[5];
              fVar39 = pfVar3[6];
              fVar162 = pfVar3[7];
              pfVar3 = (float *)((long)pfVar153 + lVar149 + 0x40);
              fVar40 = *pfVar3;
              fVar41 = pfVar3[1];
              fVar42 = pfVar3[2];
              fVar43 = pfVar3[3];
              fVar44 = pfVar3[4];
              fVar45 = pfVar3[5];
              fVar46 = pfVar3[6];
              pfVar3 = (float *)((long)pfVar154 + lVar149 + 0x20);
              fVar47 = *pfVar3;
              fVar48 = pfVar3[1];
              fVar49 = pfVar3[2];
              fVar50 = pfVar3[3];
              fVar51 = pfVar3[4];
              fVar52 = pfVar3[5];
              fVar53 = pfVar3[6];
              in_register_0000129c = pfVar3[7];
              pfVar3 = (float *)((long)pfVar156 + lVar149);
              fVar54 = pfVar3[1];
              fVar55 = pfVar3[2];
              fVar56 = pfVar3[3];
              fVar57 = pfVar3[4];
              fVar58 = pfVar3[5];
              fVar59 = pfVar3[6];
              pfVar4 = (float *)((long)pfVar154 + lVar149 + 0x40);
              fVar91 = *pfVar4;
              fVar92 = pfVar4[1];
              fVar161 = pfVar4[2];
              fVar168 = pfVar4[3];
              fVar173 = pfVar4[4];
              fVar174 = pfVar4[5];
              fVar93 = pfVar4[6];
              in_register_0000159c = pfVar4[7];
              fVar175 = in_register_0000149c + in_register_000014dc;
              pfVar4 = (float *)((long)pfVar153 + lVar149);
              fVar60 = pfVar4[1];
              fVar61 = pfVar4[2];
              fVar171 = pfVar4[3];
              fVar62 = pfVar4[4];
              fVar63 = pfVar4[5];
              fVar64 = pfVar4[6];
              fVar178 = fVar175 + in_register_000014dc + in_register_000014dc;
              pfVar11 = (float *)((long)pfVar154 + lVar149);
              fVar65 = pfVar11[1];
              fVar66 = pfVar11[2];
              fVar67 = pfVar11[3];
              fVar68 = pfVar11[4];
              fVar69 = pfVar11[5];
              fVar70 = pfVar11[6];
              fVar179 = fVar178 + in_register_000014dc + in_register_000014dc;
              pfVar5 = (float *)((long)pfVar156 + lVar149 + 0x60);
              fVar71 = *pfVar5;
              fVar72 = pfVar5[1];
              fVar73 = pfVar5[2];
              fVar74 = pfVar5[3];
              fVar75 = pfVar5[4];
              fVar76 = pfVar5[5];
              fVar77 = pfVar5[6];
              pfVar5 = (float *)((long)pfVar153 + lVar149 + 0x60);
              fVar78 = *pfVar5;
              fVar79 = pfVar5[1];
              fVar80 = pfVar5[2];
              fVar81 = pfVar5[3];
              fVar170 = pfVar5[4];
              fVar82 = pfVar5[5];
              fVar83 = pfVar5[6];
              pfVar5 = (float *)((long)pfVar154 + lVar149 + 0x60);
              fVar84 = *pfVar5;
              fVar85 = pfVar5[1];
              fVar86 = pfVar5[2];
              fVar87 = pfVar5[3];
              fVar88 = pfVar5[4];
              fVar89 = pfVar5[5];
              fVar90 = pfVar5[6];
              in_register_0000149c = fVar179 + in_register_000014dc + in_register_000014dc;
              pfVar5 = (float *)((long)pfVar155 + lVar149);
              *pfVar5 = auVar144._0_4_ * *pfVar11 + fVar47 * auVar145._0_4_ + fVar91 * local_b8 +
                        fVar101 * *pfVar4 + fVar33 * local_1b8 + fVar40 * fVar125 +
                        fVar164 * local_178 + fVar24 * local_158 +
                        local_1f8 + auVar143._0_4_ * *pfVar3;
              pfVar5[1] = auVar144._4_4_ * fVar65 + fVar48 * auVar145._4_4_ + fVar92 * fStack_b4 +
                          fVar102 * fVar60 + fVar34 * fStack_1b4 + fVar41 * fVar126 +
                          fVar165 * fStack_174 + fVar25 * fStack_154 +
                          fStack_1f4 + auVar143._4_4_ * fVar54;
              pfVar5[2] = auVar144._8_4_ * fVar66 + fVar49 * auVar145._8_4_ + fVar161 * fStack_b0 +
                          fVar103 * fVar61 + fVar35 * fStack_1b0 + fVar42 * fVar127 +
                          fVar166 * fStack_170 + fVar26 * fStack_150 +
                          fStack_1f0 + auVar143._8_4_ * fVar55;
              pfVar5[3] = auVar144._12_4_ * fVar67 + fVar50 * auVar145._12_4_ + fVar168 * fStack_ac
                          + fVar104 * fVar171 + fVar36 * fStack_1ac + fVar43 * fVar128 +
                            fVar177 * fStack_16c + fVar27 * fStack_14c +
                            fStack_1ec + fStack_18c * fVar56;
              pfVar5[4] = auVar144._16_4_ * fVar68 + fVar51 * auVar145._16_4_ + fVar173 * fStack_a8
                          + fVar105 * fVar62 + fVar37 * fStack_1a8 + fVar44 * fVar129 +
                            fVar28 * fStack_168 + fVar29 * fStack_148 +
                            fStack_1e8 + fStack_188 * fVar57;
              pfVar5[5] = auVar144._20_4_ * fVar69 + fVar52 * auVar145._20_4_ + fVar174 * fStack_a4
                          + fVar106 * fVar63 + fVar38 * fStack_1a4 + fVar45 * fVar130 +
                            fVar31 * fStack_164 + fVar30 * fStack_144 +
                            fStack_1e4 + fStack_184 * fVar58;
              pfVar5[6] = auVar144._24_4_ * fVar70 + fVar53 * auVar145._24_4_ + fVar93 * fStack_a0 +
                          fVar107 * fVar64 + fVar39 * fStack_1a0 + fVar46 * fVar131 +
                          fVar23 * fStack_160 + fVar32 * fStack_140 +
                          fStack_1e0 + fStack_180 * fVar59;
              pfVar5[7] = fVar179 + fVar178 + fVar175 + fStack_1dc + fVar22;
              fVar162 = in_register_0000149c +
                        fStack_1dc + fStack_9c + fStack_15c + fVar162 +
                        fVar132 + in_register_0000129c + in_register_0000129c;
              pfVar3 = (float *)((long)pfVar155 + lVar149 + 0x20);
              *pfVar3 = local_158 * fVar71 + fVar125 * fVar78 + local_b8 * fVar84 +
                        local_1f8 + auVar143._0_4_ * fVar164 + fVar24 * local_178 + fVar33 * fVar101
                        + local_1b8 * fVar40 + auVar144._0_4_ * fVar47 + fVar91 * auVar145._0_4_;
              pfVar3[1] = fStack_154 * fVar72 + fVar126 * fVar79 + fStack_b4 * fVar85 +
                          fStack_1f4 + auVar143._4_4_ * fVar165 +
                          fVar25 * fStack_174 + fVar34 * fVar102 +
                          fStack_1b4 * fVar41 + auVar144._4_4_ * fVar48 + fVar92 * auVar145._4_4_;
              pfVar3[2] = fStack_150 * fVar73 + fVar127 * fVar80 + fStack_b0 * fVar86 +
                          fStack_1f0 + auVar143._8_4_ * fVar166 +
                          fVar26 * fStack_170 + fVar35 * fVar103 +
                          fStack_1b0 * fVar42 + auVar144._8_4_ * fVar49 + fVar161 * auVar145._8_4_;
              pfVar3[3] = fStack_14c * fVar74 + fVar128 * fVar81 + fStack_ac * fVar87 +
                          fStack_1ec + fStack_18c * fVar177 + fVar27 * fStack_16c + fVar36 * fVar104
                          + fStack_1ac * fVar43 + auVar144._12_4_ * fVar50 +
                            fVar168 * auVar145._12_4_;
              pfVar3[4] = fStack_148 * fVar75 + fVar129 * fVar170 + fStack_a8 * fVar88 +
                          fStack_1e8 + fStack_188 * fVar28 + fVar29 * fStack_168 + fVar37 * fVar105
                          + fStack_1a8 * fVar44 + auVar144._16_4_ * fVar51 +
                            fVar173 * auVar145._16_4_;
              pfVar3[5] = fStack_144 * fVar76 + fVar130 * fVar82 + fStack_a4 * fVar89 +
                          fStack_1e4 + fStack_184 * fVar31 + fVar30 * fStack_164 + fVar38 * fVar106
                          + fStack_1a4 * fVar45 + auVar144._20_4_ * fVar52 +
                            fVar174 * auVar145._20_4_;
              pfVar3[6] = fStack_140 * fVar77 + fVar131 * fVar83 + fStack_a0 * fVar90 +
                          fStack_1e0 + fStack_180 * fVar23 + fVar32 * fStack_160 + fVar39 * fVar107
                          + fStack_1a0 * fVar46 + auVar144._24_4_ * fVar53 +
                            fVar93 * auVar145._24_4_;
              pfVar3[7] = fVar162;
              uVar148 = uVar147 + 2;
              lVar149 = lVar149 + 0x40;
              iVar146 = uVar147 + 3;
              uVar147 = uVar148;
            } while (iVar146 < (int)uVar18);
            pfVar155 = (float *)((long)pfVar155 + lVar149);
            pfVar156 = (float *)((long)pfVar156 + lVar149);
            pfVar153 = (float *)((long)pfVar153 + lVar149);
            pfVar154 = (float *)((long)pfVar154 + lVar149);
            auVar176 = ZEXT3264(auVar15);
            in_register_000012dc = fVar108;
          }
          iVar146 = uVar18 - uVar148;
          if (iVar146 != 0 && (int)uVar148 <= (int)uVar18) {
            lVar152 = 0x40;
            lVar149 = 0;
            do {
              pfVar5 = (float *)((long)pfVar156 + lVar152 + -0x40);
              fVar22 = pfVar5[1];
              fVar164 = pfVar5[2];
              fVar165 = pfVar5[3];
              fVar166 = pfVar5[4];
              fVar177 = pfVar5[5];
              fVar28 = pfVar5[6];
              pfVar11 = (float *)((long)pfVar156 + lVar152 + -0x20);
              fVar31 = pfVar11[1];
              fVar23 = pfVar11[2];
              fVar24 = pfVar11[3];
              fVar25 = pfVar11[4];
              fVar26 = pfVar11[5];
              fVar27 = pfVar11[6];
              pfVar3 = (float *)((long)pfVar156 + lVar152);
              fVar29 = pfVar3[1];
              fVar30 = pfVar3[2];
              fVar32 = pfVar3[3];
              fVar33 = pfVar3[4];
              fVar34 = pfVar3[5];
              fVar35 = pfVar3[6];
              pfVar6 = (float *)((long)pfVar153 + lVar152 + -0x40);
              fVar36 = pfVar6[1];
              fVar37 = pfVar6[2];
              fVar38 = pfVar6[3];
              fVar39 = pfVar6[4];
              fVar40 = pfVar6[5];
              fVar41 = pfVar6[6];
              pfVar7 = (float *)((long)pfVar153 + lVar152 + -0x20);
              fVar42 = pfVar7[1];
              fVar43 = pfVar7[2];
              fVar44 = pfVar7[3];
              fVar45 = pfVar7[4];
              fVar46 = pfVar7[5];
              fVar47 = pfVar7[6];
              pfVar4 = (float *)((long)pfVar153 + lVar152);
              fVar48 = pfVar4[1];
              fVar49 = pfVar4[2];
              fVar50 = pfVar4[3];
              fVar51 = pfVar4[4];
              fVar52 = pfVar4[5];
              fVar53 = pfVar4[6];
              fVar162 = fVar108 + fStack_13c + in_register_000012dc;
              pfVar8 = (float *)((long)pfVar154 + lVar152 + -0x40);
              fVar54 = pfVar8[1];
              fVar55 = pfVar8[2];
              fVar56 = pfVar8[3];
              fVar57 = pfVar8[4];
              fVar58 = pfVar8[5];
              fVar59 = pfVar8[6];
              pfVar9 = (float *)((long)pfVar154 + lVar152 + -0x20);
              fVar60 = pfVar9[1];
              fVar61 = pfVar9[2];
              fVar171 = pfVar9[3];
              fVar62 = pfVar9[4];
              fVar63 = pfVar9[5];
              fVar64 = pfVar9[6];
              pfVar12 = (float *)((long)pfVar154 + lVar152);
              fVar65 = pfVar12[1];
              fVar66 = pfVar12[2];
              fVar67 = pfVar12[3];
              fVar68 = pfVar12[4];
              fVar69 = pfVar12[5];
              fVar70 = pfVar12[6];
              fVar162 = fStack_17c + fStack_1dc + fStack_15c + fStack_13c + fVar162 +
                        fStack_13c + fVar162 + fStack_13c;
              pfVar10 = (float *)((long)pfVar155 + lVar152 + -0x40);
              *pfVar10 = local_198 * *pfVar5 + local_1f8 +
                         local_178 * *pfVar11 + local_158 * *pfVar3 +
                         fVar101 * *pfVar6 + local_1b8 * *pfVar7 + fVar125 * *pfVar4 +
                         fVar109 * *pfVar8 + fVar117 * *pfVar9 + auVar176._0_4_ * *pfVar12;
              pfVar10[1] = fStack_194 * fVar22 + fStack_1f4 +
                           fStack_174 * fVar31 + fStack_154 * fVar29 +
                           fVar102 * fVar36 + fStack_1b4 * fVar42 + fVar126 * fVar48 +
                           fVar110 * fVar54 + fVar118 * fVar60 + auVar176._4_4_ * fVar65;
              pfVar10[2] = fStack_190 * fVar164 + fStack_1f0 +
                           fStack_170 * fVar23 + fStack_150 * fVar30 +
                           fVar103 * fVar37 + fStack_1b0 * fVar43 + fVar127 * fVar49 +
                           fVar111 * fVar55 + fVar119 * fVar61 + auVar176._8_4_ * fVar66;
              pfVar10[3] = fStack_18c * fVar165 + fStack_1ec +
                           fStack_16c * fVar24 + fStack_14c * fVar32 +
                           fVar104 * fVar38 + fStack_1ac * fVar44 + fVar128 * fVar50 +
                           fVar112 * fVar56 + fVar120 * fVar171 + auVar176._12_4_ * fVar67;
              pfVar10[4] = fStack_188 * fVar166 + fStack_1e8 +
                           fStack_168 * fVar25 + fStack_148 * fVar33 +
                           fVar105 * fVar39 + fStack_1a8 * fVar45 + fVar129 * fVar51 +
                           fVar113 * fVar57 + fVar121 * fVar62 + auVar176._16_4_ * fVar68;
              pfVar10[5] = fStack_184 * fVar177 + fStack_1e4 +
                           fStack_164 * fVar26 + fStack_144 * fVar34 +
                           fVar106 * fVar40 + fStack_1a4 * fVar46 + fVar130 * fVar52 +
                           fVar114 * fVar58 + fVar122 * fVar63 + auVar176._20_4_ * fVar69;
              pfVar10[6] = fStack_180 * fVar28 + fStack_1e0 +
                           fStack_160 * fVar27 + fStack_140 * fVar35 +
                           fVar107 * fVar41 + fStack_1a0 * fVar47 + fVar131 * fVar53 +
                           fVar115 * fVar59 + fVar123 * fVar64 + auVar176._24_4_ * fVar70;
              pfVar10[7] = fVar162;
              lVar149 = lVar149 + -0x20;
              lVar152 = lVar152 + 0x20;
              iVar146 = iVar146 + -1;
            } while (iVar146 != 0);
            pfVar155 = (float *)((long)pfVar155 - lVar149);
            pfVar156 = (float *)((long)pfVar156 - lVar149);
            pfVar153 = (float *)((long)pfVar153 - lVar149);
            pfVar154 = (float *)((long)pfVar154 - lVar149);
            in_register_0000129c = fStack_13c;
          }
          pfVar156 = pfVar156 + 0x10;
          pfVar153 = pfVar153 + 0x10;
          pfVar154 = pfVar154 + 0x10;
          iVar151 = iVar151 + 1;
        } while (iVar151 != iVar19);
      }
      lVar150 = lVar150 + 1;
    } while (lVar150 != iVar17);
  }
  return;
}

Assistant:

static void convdw3x3s1_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + g * 8) : _mm256_set1_ps(0.f);

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);

        __m256 _k00 = _mm256_loadu_ps(k0);
        __m256 _k01 = _mm256_loadu_ps(k0 + 8);
        __m256 _k02 = _mm256_loadu_ps(k0 + 16);
        __m256 _k10 = _mm256_loadu_ps(k0 + 24);
        __m256 _k11 = _mm256_loadu_ps(k0 + 32);
        __m256 _k12 = _mm256_loadu_ps(k0 + 40);
        __m256 _k20 = _mm256_loadu_ps(k0 + 48);
        __m256 _k21 = _mm256_loadu_ps(k0 + 56);
        __m256 _k22 = _mm256_loadu_ps(k0 + 64);

        int i = 0;

        for (; i < outh; i++)
        {
            int j = 0;
            for (; j + 7 < outw; j += 8)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                __m256 _sum1 = _bias0;
                __m256 _r03 = _mm256_loadu_ps(r0 + 24);
                __m256 _r13 = _mm256_loadu_ps(r1 + 24);
                __m256 _r23 = _mm256_loadu_ps(r2 + 24);
                _mm256_storeu_ps(outptr0, _sum0);

                _sum1 = _mm256_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r23, _sum1);

                __m256 _sum2 = _bias0;
                __m256 _r04 = _mm256_loadu_ps(r0 + 32);
                __m256 _r14 = _mm256_loadu_ps(r1 + 32);
                __m256 _r24 = _mm256_loadu_ps(r2 + 32);
                _mm256_storeu_ps(outptr0 + 8, _sum1);

                _sum2 = _mm256_comp_fmadd_ps(_k00, _r02, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k01, _r03, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k02, _r04, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k10, _r12, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k11, _r13, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k12, _r14, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k20, _r22, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k21, _r23, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k22, _r24, _sum2);

                __m256 _sum3 = _bias0;
                __m256 _r05 = _mm256_loadu_ps(r0 + 40);
                __m256 _r15 = _mm256_loadu_ps(r1 + 40);
                __m256 _r25 = _mm256_loadu_ps(r2 + 40);
                _mm256_storeu_ps(outptr0 + 16, _sum2);

                _sum3 = _mm256_comp_fmadd_ps(_k00, _r03, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k01, _r04, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k02, _r05, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k10, _r13, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k11, _r14, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k12, _r15, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k20, _r23, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k21, _r24, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k22, _r25, _sum3);

                __m256 _sum4 = _bias0;
                __m256 _r06 = _mm256_loadu_ps(r0 + 48);
                __m256 _r16 = _mm256_loadu_ps(r1 + 48);
                __m256 _r26 = _mm256_loadu_ps(r2 + 48);
                _mm256_storeu_ps(outptr0 + 24, _sum3);

                _sum4 = _mm256_comp_fmadd_ps(_k00, _r04, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k01, _r05, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k02, _r06, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k10, _r14, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k11, _r15, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k12, _r16, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k20, _r24, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k21, _r25, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k22, _r26, _sum4);

                __m256 _sum5 = _bias0;
                __m256 _r07 = _mm256_loadu_ps(r0 + 56);
                __m256 _r17 = _mm256_loadu_ps(r1 + 56);
                __m256 _r27 = _mm256_loadu_ps(r2 + 56);
                _mm256_storeu_ps(outptr0 + 32, _sum4);

                _sum5 = _mm256_comp_fmadd_ps(_k00, _r05, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k01, _r06, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k02, _r07, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k10, _r15, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k11, _r16, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k12, _r17, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k20, _r25, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k21, _r26, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k22, _r27, _sum5);

                __m256 _sum6 = _bias0;
                __m256 _r08 = _mm256_loadu_ps(r0 + 64);
                __m256 _r18 = _mm256_loadu_ps(r1 + 64);
                __m256 _r28 = _mm256_loadu_ps(r2 + 64);
                _mm256_storeu_ps(outptr0 + 40, _sum5);

                _sum6 = _mm256_comp_fmadd_ps(_k00, _r06, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k01, _r07, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k02, _r08, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k10, _r16, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k11, _r17, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k12, _r18, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k20, _r26, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k21, _r27, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k22, _r28, _sum6);

                __m256 _sum7 = _bias0;
                __m256 _r09 = _mm256_loadu_ps(r0 + 72);
                __m256 _r19 = _mm256_loadu_ps(r1 + 72);
                __m256 _r29 = _mm256_loadu_ps(r2 + 72);
                _mm256_storeu_ps(outptr0 + 48, _sum6);

                _sum7 = _mm256_comp_fmadd_ps(_k00, _r07, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k01, _r08, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k02, _r09, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k10, _r17, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k11, _r18, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k12, _r19, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k20, _r27, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k21, _r28, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k22, _r29, _sum7);
                _mm256_storeu_ps(outptr0 + 56, _sum7);

                r0 += 64;
                r1 += 64;
                r2 += 64;
                outptr0 += 64;
            }
            for (; j + 3 < outw; j += 4)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                __m256 _sum1 = _bias0;
                __m256 _r03 = _mm256_loadu_ps(r0 + 24);
                __m256 _r13 = _mm256_loadu_ps(r1 + 24);
                __m256 _r23 = _mm256_loadu_ps(r2 + 24);
                _mm256_storeu_ps(outptr0, _sum0);

                _sum1 = _mm256_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r23, _sum1);

                __m256 _sum2 = _bias0;
                __m256 _r04 = _mm256_loadu_ps(r0 + 32);
                __m256 _r14 = _mm256_loadu_ps(r1 + 32);
                __m256 _r24 = _mm256_loadu_ps(r2 + 32);
                _mm256_storeu_ps(outptr0 + 8, _sum1);

                _sum2 = _mm256_comp_fmadd_ps(_k00, _r02, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k01, _r03, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k02, _r04, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k10, _r12, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k11, _r13, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k12, _r14, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k20, _r22, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k21, _r23, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k22, _r24, _sum2);

                __m256 _sum3 = _bias0;
                __m256 _r05 = _mm256_loadu_ps(r0 + 40);
                __m256 _r15 = _mm256_loadu_ps(r1 + 40);
                __m256 _r25 = _mm256_loadu_ps(r2 + 40);
                _mm256_storeu_ps(outptr0 + 16, _sum2);

                _sum3 = _mm256_comp_fmadd_ps(_k00, _r03, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k01, _r04, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k02, _r05, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k10, _r13, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k11, _r14, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k12, _r15, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k20, _r23, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k21, _r24, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k22, _r25, _sum3);

                _mm256_storeu_ps(outptr0 + 24, _sum3);

                r0 += 32;
                r1 += 32;
                r2 += 32;
                outptr0 += 32;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                __m256 _sum1 = _bias0;
                __m256 _r03 = _mm256_loadu_ps(r0 + 24);
                __m256 _r13 = _mm256_loadu_ps(r1 + 24);
                __m256 _r23 = _mm256_loadu_ps(r2 + 24);
                _mm256_storeu_ps(outptr0, _sum0);

                _sum1 = _mm256_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r23, _sum1);

                _mm256_storeu_ps(outptr0 + 8, _sum1);

                r0 += 16;
                r1 += 16;
                r2 += 16;
                outptr0 += 16;
            }
            for (; j < outw; j++)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                _mm256_storeu_ps(outptr0, _sum0);

                r0 += 8;
                r1 += 8;
                r2 += 8;
                outptr0 += 8;
            }

            r0 += 2 * 8;
            r1 += 2 * 8;
            r2 += 2 * 8;
        }
    }
}